

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O3

vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *
tinyusdz::lerp<tinyusdz::value::color4d>
          (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *a,
          vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *b,double t)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  pointer pcVar4;
  pointer pcVar5;
  pointer pcVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  ulong uVar13;
  long lVar14;
  ulong __new_size;
  double dVar15;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar13 = (long)(a->
                 super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(a->
                 super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5;
  __new_size = (long)(b->
                     super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(b->
                     super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (uVar13 <= __new_size) {
    __new_size = uVar13;
  }
  if (__new_size != 0) {
    ::std::vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::resize
              (__return_storage_ptr__,__new_size);
    pcVar4 = (a->
             super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pcVar5 = (b->
             super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((long)(a->
              super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar4 ==
        (long)(b->
              super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar5) {
      dVar15 = 1.0 - t;
      pcVar6 = (__return_storage_ptr__->
               super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar14 = 0x10;
      do {
        pdVar1 = (double *)((long)pcVar4 + lVar14 + -0x10);
        dVar7 = pdVar1[1];
        pdVar3 = (double *)((long)&pcVar4->r + lVar14);
        dVar8 = *pdVar3;
        dVar9 = pdVar3[1];
        pdVar2 = (double *)((long)pcVar5 + lVar14 + -0x10);
        dVar10 = pdVar2[1];
        pdVar3 = (double *)((long)&pcVar5->r + lVar14);
        dVar11 = *pdVar3;
        dVar12 = pdVar3[1];
        pdVar3 = (double *)((long)pcVar6 + lVar14 + -0x10);
        *pdVar3 = *pdVar2 * t + *pdVar1 * dVar15;
        pdVar3[1] = dVar10 * t + dVar7 * dVar15;
        pdVar3 = (double *)((long)&pcVar6->r + lVar14);
        *pdVar3 = dVar11 * t + dVar8 * dVar15;
        pdVar3[1] = dVar12 * t + dVar9 * dVar15;
        lVar14 = lVar14 + 0x20;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}